

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTSerializer.cpp
# Opt level: O2

ssize_t __thiscall
slang::ast::ASTSerializer::write(ASTSerializer *this,int __fd,void *__buf,size_t __n)

{
  JsonWriter *this_00;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  string_view name;
  string_view value;
  string local_38;
  
  name._M_len._4_4_ = in_register_00000034;
  name._M_len._0_4_ = __fd;
  name._M_str = (char *)__buf;
  JsonWriter::writeProperty(this->writer,name);
  this_00 = this->writer;
  ConstantValue::toString_abi_cxx11_(&local_38,(ConstantValue *)__n,0xffffff,true,true);
  value._M_str = local_38._M_dataplus._M_p;
  value._M_len = local_38._M_string_length;
  JsonWriter::writeValue(this_00,value);
  std::__cxx11::string::~string((string *)&local_38);
  return extraout_RAX;
}

Assistant:

void ASTSerializer::write(std::string_view name, const ConstantValue& value) {
    writer.writeProperty(name);
    writer.writeValue(value.toString(SVInt::MAX_BITS, /* exactUnknowns */ true,
                                     /* useAssignmentPatterns */ true));
}